

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidScaleBiasWeights(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  WeightParams *pWVar3;
  ostream *poVar4;
  Result local_b8;
  int i_1;
  int num_bias;
  int i;
  int num_channel;
  ScaleLayerParams *params;
  NeuralNetworkLayer *scaleLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out3 = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"probs");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  scaleLayer = (NeuralNetworkLayer *)
               CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  params = (ScaleLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)scaleLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"probs");
  _i = CoreML::Specification::NeuralNetworkLayer::mutable_scale((NeuralNetworkLayer *)params);
  num_bias = 5;
  CoreML::Specification::ScaleLayerParams::add_shapescale(_i,5);
  for (i_1 = 0; i_1 < num_bias + -1; i_1 = i_1 + 1) {
    pWVar3 = CoreML::Specification::ScaleLayerParams::mutable_scale(_i);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar3,1.0);
  }
  local_b8.m_message._M_storage._M_storage[4] = '\x03';
  local_b8.m_message._M_storage._M_storage[5] = '\0';
  local_b8.m_message._M_storage._M_storage[6] = '\0';
  local_b8.m_message._M_storage._M_storage[7] = '\0';
  CoreML::Specification::ScaleLayerParams::add_shapebias(_i,3);
  CoreML::Specification::ScaleLayerParams::add_shapebias
            (_i,(long)(int)local_b8.m_message._M_storage._M_storage._4_4_);
  CoreML::Specification::ScaleLayerParams::add_shapebias
            (_i,(long)(int)local_b8.m_message._M_storage._M_storage._4_4_);
  CoreML::Specification::ScaleLayerParams::set_hasbias(_i,true);
  local_b8.m_message._M_storage._M_storage[0] = '\0';
  local_b8.m_message._M_storage._M_storage[1] = '\0';
  local_b8.m_message._M_storage._M_storage[2] = '\0';
  local_b8.m_message._M_storage._M_storage[3] = '\0';
  for (; (int)local_b8.m_message._M_storage._M_storage._0_4_ <
         local_b8.m_message._M_storage._M_storage._4_4_ *
         local_b8.m_message._M_storage._M_storage._4_4_ *
         local_b8.m_message._M_storage._M_storage._4_4_ + -1;
      local_b8.m_message._M_storage._M_storage._0_4_ =
           local_b8.m_message._M_storage._M_storage._0_4_ + 1) {
    pWVar3 = CoreML::Specification::ScaleLayerParams::mutable_bias(_i);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar3,1.0);
  }
  CoreML::validate<(MLModelType)500>(&local_b8,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_b8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe35);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_b8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidScaleBiasWeights() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *scaleLayer = nn->add_layers();
    scaleLayer->add_input("input");
    scaleLayer->add_output("probs");
    auto *params = scaleLayer->mutable_scale();
    int num_channel = 5;
    params->add_shapescale(num_channel);

    for (int i = 0; i < num_channel - 1; i++) {
        params->mutable_scale()->add_floatvalue(1.0);
    }

    int num_bias = 3;
    // shape scale needs length 1 or 3
    params->add_shapebias(num_bias);
    params->add_shapebias(num_bias);
    params->add_shapebias(num_bias);

    params->set_hasbias(true);
    for (int i = 0; i < num_bias*num_bias*num_bias - 1; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}